

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall glslang::TSymbolTable::pop(TSymbolTable *this,TPrecisionQualifier *p)

{
  TSymbolTableLevel *this_00;
  int iVar1;
  reference ppTVar2;
  TPrecisionQualifier *p_local;
  TSymbolTable *this_local;
  
  iVar1 = currentLevel(this);
  ppTVar2 = std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ::operator[](&this->table,(long)iVar1);
  TSymbolTableLevel::getPreviousDefaultPrecisions(*ppTVar2,p);
  ppTVar2 = std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ::back(&this->table);
  this_00 = *ppTVar2;
  if (this_00 != (TSymbolTableLevel *)0x0) {
    TSymbolTableLevel::~TSymbolTableLevel(this_00);
    TSymbolTableLevel::operator_delete(this_00,p);
  }
  std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::pop_back
            (&this->table);
  updateUniqueIdLevelFlag(this);
  return;
}

Assistant:

void pop(TPrecisionQualifier *p)
    {
        table[currentLevel()]->getPreviousDefaultPrecisions(p);
        delete table.back();
        table.pop_back();
        updateUniqueIdLevelFlag();
    }